

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O2

int imsg_composev(imsgbuf *ibuf,u_int32_t type,u_int32_t peerid,pid_t pid,int fd,iovec *iov,
                 int iovcnt)

{
  int iVar1;
  ulong uVar2;
  ibuf *msg;
  long lVar3;
  u_int16_t datalen;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)iovcnt;
  if (iovcnt < 1) {
    uVar4 = uVar2;
  }
  datalen = 0;
  for (; uVar4 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
    datalen = datalen + *(short *)((long)&iov->iov_len + uVar2);
  }
  msg = imsg_create(ibuf,type,peerid,pid,datalen);
  if (msg != (ibuf *)0x0) {
    lVar3 = 0;
    do {
      if (uVar4 * 0x10 + 0x10 == lVar3 + 0x10) {
        msg->fd = fd;
        imsg_close(ibuf,msg);
        return 1;
      }
      iVar1 = imsg_add(msg,*(void **)((long)&iov->iov_base + lVar3),
                       *(u_int16_t *)((long)&iov->iov_len + lVar3));
      lVar3 = lVar3 + 0x10;
    } while (iVar1 != -1);
  }
  return -1;
}

Assistant:

int
imsg_composev(struct imsgbuf *ibuf, u_int32_t type, u_int32_t peerid,
    pid_t pid, int fd, const struct iovec *iov, int iovcnt)
{
	struct ibuf	*wbuf;
	int		 i, datalen = 0;

	for (i = 0; i < iovcnt; i++)
		datalen += iov[i].iov_len;

	if ((wbuf = imsg_create(ibuf, type, peerid, pid, datalen)) == NULL)
		return (-1);

	for (i = 0; i < iovcnt; i++)
		if (imsg_add(wbuf, iov[i].iov_base, iov[i].iov_len) == -1)
			return (-1);

	wbuf->fd = fd;

	imsg_close(ibuf, wbuf);

	return (1);
}